

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::
log_<fmt::v6::basic_string_view<char>,std::__cxx11::string,MetricTypes::MetricType,long,int>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,MetricType *args_1
          ,long *args_2,int *args_3)

{
  string_view_t msg;
  string_view_t a_logger_name;
  char *s;
  size_t count;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  logger *in_stack_fffffffffffffd38;
  logger *in_stack_fffffffffffffd40;
  level_enum in_stack_fffffffffffffd9c;
  log_msg *in_stack_fffffffffffffda0;
  long *in_stack_fffffffffffffda8;
  MetricType *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string_view<char> *in_stack_fffffffffffffdc0;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  source_loc in_stack_fffffffffffffdd0;
  basic_string_view<char> local_218 [2];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_1f0;
  log_msg *local_1e8;
  buffer<char> *local_178;
  allocator<char> local_159;
  buffer<char> local_158 [9];
  undefined1 local_32;
  byte local_31;
  
  local_31 = should_log(in_stack_fffffffffffffd38,
                        (level_enum)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  local_32 = details::backtracer::enabled((backtracer *)0x13cccb);
  if (((local_31 & 1) != 0) || ((bool)local_32)) {
    std::allocator<char>::allocator();
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd30,(allocator<char> *)in_stack_fffffffffffffd28);
    std::allocator<char>::~allocator(&local_159);
    local_178 = (buffer<char> *)
                ::fmt::v6::
                format_to<fmt::v6::basic_string_view<char>,std::__cxx11::string_const&,MetricTypes::MetricType_const&,long_const&,int_const&,250ul,char>
                          (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                           in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                           in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
    local_1e8 = in_stack_00000018;
    pbStack_1f0 = in_stack_00000010;
    ::fmt::v6::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    s = ::fmt::v6::internal::buffer<char>::data(local_158);
    count = ::fmt::v6::internal::buffer<char>::size(local_158);
    ::fmt::v6::basic_string_view<char>::basic_string_view(local_218,s,count);
    a_logger_name.size_ = (size_t)in_stack_fffffffffffffdc0;
    a_logger_name.data_ = (char *)in_stack_fffffffffffffdb8;
    msg.size_ = (size_t)in_stack_fffffffffffffdb0;
    msg.data_ = (char *)in_stack_fffffffffffffda8;
    details::log_msg::log_msg
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffdd0,a_logger_name,
               in_stack_fffffffffffffd9c,msg);
    log_it_(in_stack_fffffffffffffd40,local_1e8,SUB81((ulong)pbStack_1f0 >> 0x38,0),
            SUB81((ulong)pbStack_1f0 >> 0x30,0));
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (pbStack_1f0);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, const Args &... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, args...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }